

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O2

void jinit_huff_encoder(j_compress_ptr cinfo)

{
  jpeg_entropy_encoder *pjVar1;
  long lVar2;
  
  pjVar1 = (jpeg_entropy_encoder *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,200);
  cinfo->entropy = pjVar1;
  pjVar1->start_pass = start_pass_huff;
  for (lVar2 = -0x20; lVar2 != 0; lVar2 = lVar2 + 8) {
    *(undefined8 *)((long)&pjVar1[5].encode_mcu + lVar2) = 0;
    *(undefined8 *)((long)&pjVar1[4].start_pass + lVar2) = 0;
    *(undefined8 *)((long)&pjVar1[8].start_pass + lVar2) = 0;
    *(undefined8 *)((long)&pjVar1[6].finish_pass + lVar2) = 0;
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_huff_encoder(j_compress_ptr cinfo)
{
  huff_entropy_ptr entropy;
  int i;

  entropy = (huff_entropy_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(huff_entropy_encoder));
  cinfo->entropy = (struct jpeg_entropy_encoder *)entropy;
  entropy->pub.start_pass = start_pass_huff;

  /* Mark tables unallocated */
  for (i = 0; i < NUM_HUFF_TBLS; i++) {
    entropy->dc_derived_tbls[i] = entropy->ac_derived_tbls[i] = NULL;
#ifdef ENTROPY_OPT_SUPPORTED
    entropy->dc_count_ptrs[i] = entropy->ac_count_ptrs[i] = NULL;
#endif
  }
}